

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::SwiftCompilerShellCommand::processDiscoveredDependencies(llbuild::core::
TaskInterface,llvm::StringRef)::DepsActions::actOnRuleDependency(llvm::StringRef,llvm::StringRef_
          (void *this,StringRef dependency,StringRef unescapedWord)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BuildEngineDelegate *pBVar2;
  KeyType local_78;
  BuildKey local_50;
  
  if (*(int *)((long)this + 0x34) != 0) {
    return;
  }
  llbuild::buildsystem::BuildKey::BuildKey(&local_50,'N',unescapedWord);
  paVar1 = &local_78.key.field_2;
  local_78.key._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_50.key.key._M_dataplus._M_p,
             local_50.key.key._M_dataplus._M_p + local_50.key.key._M_string_length);
  llbuild::core::TaskInterface::discoveredDependency((TaskInterface *)((long)this + 8),&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.key._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.key._M_dataplus._M_p,local_78.key.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.key.key._M_dataplus._M_p != &local_50.key.key.field_2) {
    operator_delete(local_50.key.key._M_dataplus._M_p,
                    local_50.key.key.field_2._M_allocated_capacity + 1);
  }
  local_78.key._M_dataplus._M_p = *(pointer *)((long)this + 8);
  local_78.key._M_string_length = *(size_type *)((long)this + 0x10);
  pBVar2 = llbuild::core::TaskInterface::delegate((TaskInterface *)&local_78);
  (**(code **)(*(long *)pBVar2[1]._vptr_BuildEngineDelegate[1] + 0x78))
            (pBVar2[1]._vptr_BuildEngineDelegate[1],*(undefined8 *)((long)this + 0x28),
             unescapedWord.Data,unescapedWord.Length,0);
  return;
}

Assistant:

virtual void actOnRuleDependency(StringRef dependency,
                                       StringRef unescapedWord) override {
        // Only process dependencies for the first rule (the output file), the
        // rest are identical.
        if (ruleNumber == 0) {
          ti.discoveredDependency(BuildKey::makeNode(unescapedWord).toData());
          getBuildSystem(ti).getDelegate().commandFoundDiscoveredDependency(command, unescapedWord,
                                                                            DiscoveredDependencyKind::Input);
        }
      }